

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_container_is_subset_array(run_container_t *container1,array_container_t *container2)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ushort uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  bool bVar18;
  
  uVar4 = croaring_hardware_support();
  if ((uVar4 & 2) == 0) {
    uVar4 = croaring_hardware_support();
    if ((uVar4 & 1) == 0) {
      iVar5 = container1->n_runs;
      lVar7 = (long)iVar5;
      if (0 < lVar7) {
        lVar12 = 0;
        do {
          iVar5 = iVar5 + (uint)container1->runs[lVar12].length;
          lVar12 = lVar12 + 1;
        } while (lVar7 != lVar12);
      }
    }
    else {
      iVar5 = _avx2_run_container_cardinality(container1);
    }
  }
  else {
    iVar5 = _avx512_run_container_cardinality(container1);
  }
  iVar2 = container2->cardinality;
  if (iVar2 < iVar5) {
LAB_0011544a:
    bVar18 = false;
  }
  else {
    uVar8 = (ulong)container1->n_runs;
    bVar18 = (long)uVar8 < 1;
    if (0 < (long)uVar8) {
      puVar3 = container2->array;
      iVar5 = iVar2 + -1;
      iVar9 = -1;
      uVar13 = 0;
      do {
        uVar1 = container1->runs[uVar13].value;
        iVar6 = iVar9 + 1;
        iVar10 = iVar6;
        if ((iVar6 < iVar2) && (puVar3[iVar6] < uVar1)) {
          iVar10 = iVar9 + 2;
          iVar15 = 0;
          iVar17 = iVar5;
          if (iVar10 < iVar2) {
            iVar11 = 1;
            do {
              iVar15 = iVar11;
              iVar17 = iVar10;
              if (uVar1 <= puVar3[iVar10]) break;
              iVar15 = iVar11 * 2;
              iVar10 = iVar6 + iVar11 * 2;
              iVar11 = iVar15;
              iVar17 = iVar5;
            } while (iVar10 < iVar2);
            iVar15 = iVar15 >> 1;
          }
          iVar10 = iVar17;
          if (((puVar3[iVar17] != uVar1) && (iVar10 = iVar2, uVar1 <= puVar3[iVar17])) &&
             (iVar10 = iVar17, iVar15 + iVar6 + 1 != iVar17)) {
            iVar15 = iVar15 + iVar6;
            do {
              iVar10 = iVar15 + iVar17 >> 1;
              if (puVar3[iVar10] == uVar1) break;
              iVar11 = iVar10;
              if (puVar3[iVar10] < uVar1) {
                iVar11 = iVar17;
                iVar15 = iVar10;
              }
              iVar10 = iVar11;
              iVar17 = iVar11;
            } while (iVar15 + 1 != iVar11);
          }
        }
        uVar16 = (uint)container1->runs[uVar13].length;
        uVar4 = uVar1 + uVar16;
        iVar15 = iVar6;
        if ((iVar6 < iVar2) && (uVar14 = (ushort)uVar4, puVar3[iVar6] < uVar14)) {
          iVar9 = iVar9 + 2;
          iVar17 = 0;
          iVar11 = iVar5;
          if (iVar9 < iVar2) {
            iVar15 = 1;
            do {
              iVar11 = iVar9;
              iVar17 = iVar15;
              if (uVar14 <= puVar3[iVar9]) break;
              iVar17 = iVar15 * 2;
              iVar9 = iVar6 + iVar15 * 2;
              iVar11 = iVar5;
              iVar15 = iVar17;
            } while (iVar9 < iVar2);
            iVar17 = iVar17 >> 1;
          }
          iVar15 = iVar11;
          if (((puVar3[iVar11] != uVar14) && (iVar15 = iVar2, uVar14 <= puVar3[iVar11])) &&
             (iVar15 = iVar11, iVar17 + iVar6 + 1 != iVar11)) {
            iVar17 = iVar17 + iVar6;
            do {
              iVar15 = iVar17 + iVar11 >> 1;
              if (puVar3[iVar15] == uVar14) break;
              iVar9 = iVar15;
              if (puVar3[iVar15] < uVar14) {
                iVar9 = iVar11;
                iVar17 = iVar15;
              }
              iVar15 = iVar9;
              iVar11 = iVar9;
            } while (iVar17 + 1 != iVar9);
          }
        }
        iVar9 = iVar15;
        if (iVar9 == iVar2) {
          return false;
        }
        if (iVar9 - iVar10 != uVar16) {
          return false;
        }
        if ((puVar3[iVar10] != uVar1) || (uVar4 != puVar3[iVar9])) goto LAB_0011544a;
        uVar13 = uVar13 + 1;
        bVar18 = uVar8 <= uVar13;
      } while (uVar13 != uVar8);
    }
  }
  return bVar18;
}

Assistant:

bool run_container_is_subset_array(const run_container_t* container1,
                                   const array_container_t* container2) {
    if (run_container_cardinality(container1) > container2->cardinality)
        return false;
    int32_t start_pos = -1, stop_pos = -1;
    for (int i = 0; i < container1->n_runs; ++i) {
        int32_t start = container1->runs[i].value;
        int32_t stop = start + container1->runs[i].length;
        start_pos = advanceUntil(container2->array, stop_pos,
                                 container2->cardinality, start);
        stop_pos = advanceUntil(container2->array, stop_pos,
                                container2->cardinality, stop);
        if (stop_pos == container2->cardinality) {
            return false;
        } else if (stop_pos - start_pos != stop - start ||
                   container2->array[start_pos] != start ||
                   container2->array[stop_pos] != stop) {
            return false;
        }
    }
    return true;
}